

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

monst * revive(obj *obj)

{
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  boolean bVar7;
  int iVar9;
  byte bVar8;
  uint uVar10;
  char *pcVar11;
  monst *pmVar12;
  monst *mtmp2;
  int y2;
  int x2;
  monst *ghost;
  coord local_48;
  coord local_46;
  uint m_id;
  coord xy;
  coord new_xy;
  int holder;
  monst *carrier;
  char local_2f;
  xchar y;
  xchar x;
  int montype;
  boolean in_container;
  boolean recorporealization;
  schar savetame;
  obj *poStack_28;
  int container_nesting;
  obj *container;
  monst *mtmp;
  obj *obj_local;
  
  container = (obj *)0x0;
  poStack_28 = (obj *)0x0;
  montype = 0;
  x = '\0';
  y = '\0';
  local_2f = '\0';
  if (obj->otyp != 0x10e) {
    return (monst *)0x0;
  }
  carrier._4_4_ = obj->corpsenm;
  mtmp = (monst *)obj;
  if (obj->where == '\x02') {
    m_id = 0;
    poStack_28 = (obj->v).v_nexthere;
    _xy = get_container_location(poStack_28,(int *)&m_id,&montype);
    if (m_id == 1) {
      bVar7 = get_obj_location((obj *)mtmp,(xchar *)((long)&carrier + 3),
                               (xchar *)((long)&carrier + 2),1);
      if (bVar7 == '\0') {
        return (monst *)0x0;
      }
    }
    else if (m_id == 3) {
      carrier._3_1_ = u.ux;
      carrier._2_1_ = u.uy;
    }
    else {
      if (m_id != 4) {
        return (monst *)0x0;
      }
      carrier._3_1_ = _xy->mx;
      carrier._2_1_ = _xy->my;
    }
    local_2f = '\x01';
  }
  else {
    bVar7 = get_obj_location(obj,(xchar *)((long)&carrier + 3),(xchar *)((long)&carrier + 2),0);
    if (bVar7 == '\0') {
      return (monst *)0x0;
    }
  }
  if ((local_2f != '\0') &&
     (((((carrier._3_1_ == '\0' || (carrier._2_1_ == '\0')) ||
        ((*(uint *)&poStack_28->field_0x4a >> 0xd & 1) != 0)) ||
       ((2 < montype || (poStack_28->otyp == 0x215)))) ||
      ((poStack_28->otyp == 0xe0 && (iVar9 = rn2(0x28), iVar9 != 0)))))) {
    return (monst *)0x0;
  }
  if (((level->monsters[carrier._3_1_][carrier._2_1_] != (monst *)0x0) &&
      ((*(uint *)&level->monsters[carrier._3_1_][carrier._2_1_]->field_0x60 >> 9 & 1) == 0)) &&
     (bVar7 = enexto(&local_46,level,carrier._3_1_,carrier._2_1_,mons + carrier._4_4_),
     bVar7 != '\0')) {
    carrier._3_1_ = local_46.x;
    carrier._2_1_ = local_46.y;
  }
  bVar7 = cant_create((int *)((long)&carrier + 4),'\x01');
  if (bVar7 != '\0') {
    container = (obj *)makemon(mons + carrier._4_4_,level,(int)carrier._3_1_,(int)carrier._2_1_,3);
    if ((monst *)container != (monst *)0x0) {
      ((monst *)container)->mhpmax = 100;
      ((monst *)container)->mhp = 100;
      mon_adjust_speed((monst *)container,2,(obj *)0x0);
    }
    goto LAB_0034ab6a;
  }
  sVar3._0_1_ = mtmp->mfrozen;
  sVar3._1_1_ = mtmp->mblinded;
  if ((sVar3 == 0) || ((*(uint *)(mtmp->mtrack + 3) >> 0x15 & 3) != 1)) {
    container = (obj *)makemon(mons + carrier._4_4_,level,(int)carrier._3_1_,(int)carrier._2_1_,0x43
                              );
  }
  else {
    local_48.x = carrier._3_1_;
    local_48.y = carrier._2_1_;
    container = (obj *)montraits((obj *)mtmp,&local_48);
    if ((((monst *)container != (monst *)0x0) && (((monst *)container)->mtame != '\0')) &&
       ((*(uint *)&((monst *)container)->field_0x60 >> 0x1a & 1) == 0)) {
      wary_dog((monst *)container,'\x01');
    }
  }
  if (container == (obj *)0x0) goto LAB_0034ab6a;
  sVar4._0_1_ = mtmp->mfrozen;
  sVar4._1_1_ = mtmp->mblinded;
  if ((sVar4 != 0) && ((*(uint *)(mtmp->mtrack + 3) >> 0x15 & 3) == 2)) {
    uVar10._0_1_ = mtmp->mfleetim;
    uVar10._1_1_ = mtmp->wormno;
    uVar10._2_1_ = mtmp->weapon_check;
    uVar10._3_1_ = mtmp->field_0x67;
    pmVar12 = find_mid(level,uVar10,1);
    if ((pmVar12 != (monst *)0x0) && (pmVar12->data == mons + 0x12a)) {
      cVar1 = pmVar12->mx;
      cVar2 = pmVar12->my;
      if (pmVar12->mtame != '\0') {
        x = pmVar12->mtame;
      }
      if (pmVar12->wormno == '\0') {
        if ((viz_array[pmVar12->my][pmVar12->mx] & 2U) != 0) goto LAB_0034aa2d;
        if (((((u.uprops[0x1e].intrinsic == 0) &&
              ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           (((u.uprops[0x40].intrinsic != 0 ||
             ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            ((pmVar12->data->mflags3 & 0x200) != 0)))) {
          bVar8 = viz_array[pmVar12->my][pmVar12->mx] & 1;
          goto joined_r0x0034aa27;
        }
      }
      else {
        bVar8 = worm_known(level,pmVar12);
joined_r0x0034aa27:
        if (bVar8 != 0) {
LAB_0034aa2d:
          if ((((((*(uint *)&pmVar12->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
               || (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0))
             && ((((*(uint *)&pmVar12->field_0x60 >> 7 & 1) == 0 &&
                  ((*(uint *)&pmVar12->field_0x60 >> 9 & 1) == 0)) &&
                 (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
            pcVar11 = Monnam(pmVar12);
            pline("%s is suddenly drawn into its former body!",pcVar11);
          }
        }
      }
      mondead(pmVar12);
      y = '\x01';
      newsym((int)cVar1,(int)cVar2);
    }
    *(uint *)(mtmp->mtrack + 3) = *(uint *)(mtmp->mtrack + 3) & 0xff9fffff;
  }
  if (mtmp->mtame != '\0') {
    sVar5._0_1_ = mtmp->mfrozen;
    sVar5._1_1_ = mtmp->mblinded;
    container = (obj *)christen_monst((monst *)container,
                                      (char *)((long)(mtmp->mtrack + 0x10) + (long)(int)sVar5));
  }
  if ((*(char *)((long)&((container->v).v_nexthere)->owt + 2) == '\x1f') ||
     (uVar6._0_1_ = container->ox, uVar6._1_1_ = container->oy, uVar6._2_2_ = container->otyp,
     uVar6 == quest_status.leader_m_id)) {
    quest_status._0_4_ = quest_status._0_4_ & 0xffefffff;
  }
LAB_0034ab6a:
  if (container != (obj *)0x0) {
    iVar9._0_2_ = mtmp->movement;
    iVar9._2_2_ = mtmp->mintrinsics;
    if (iVar9 != 0) {
      uVar10 = eaten_stat(container->owt,(obj *)mtmp);
      container->owt = uVar10;
    }
    container->owornmask = container->owornmask & 0xffffbfffU | 0x4000;
    if (y != '\0') {
      if ((x != '\0') && (pmVar12 = tamedog((monst *)container,(obj *)0x0), pmVar12 != (monst *)0x0)
         ) {
        pmVar12->mtame = x;
        container = (obj *)pmVar12;
      }
      container->owornmask = container->owornmask & 0xffdfffffU | 0x200000;
    }
    switch(mtmp->mtrack[2].x) {
    case '\x01':
      carrier._3_1_ = (char)mtmp->m_id;
      carrier._2_1_ = *(char *)((long)&mtmp->m_id + 1);
      if (1 < mtmp->mhpmax) {
        mtmp = (monst *)splitobj((obj *)mtmp,1);
      }
      delobj((obj *)mtmp);
      newsym((int)carrier._3_1_,(int)carrier._2_1_);
      break;
    case '\x02':
      obj_extract_self((obj *)mtmp);
      obfree((obj *)mtmp,(obj *)0x0);
      break;
    case '\x03':
      useup((obj *)mtmp);
      break;
    case '\x04':
      m_useup((monst *)mtmp->data,(obj *)mtmp);
      break;
    default:
      panic("revive");
    }
  }
  return (monst *)container;
}

Assistant:

struct monst *revive(struct obj *obj)
{
	struct monst *mtmp = NULL;
	struct obj *container = NULL;
	int container_nesting = 0;
	schar savetame = 0;
	boolean recorporealization = FALSE;
	boolean in_container = FALSE;
	if (obj->otyp == CORPSE) {
		int montype = obj->corpsenm;
		xchar x, y;

		if (obj->where == OBJ_CONTAINED) {
			/* deal with corpses in [possibly nested] containers */
			struct monst *carrier;
			int holder = 0;

			container = obj->ocontainer;
			carrier = get_container_location(container, &holder,
							&container_nesting);
			switch(holder) {
			    case OBJ_MINVENT:
				x = carrier->mx; y = carrier->my;
				in_container = TRUE;
				break;
			    case OBJ_INVENT:
				x = u.ux; y = u.uy;
				in_container = TRUE;
				break;
			    case OBJ_FLOOR:
				if (!get_obj_location(obj, &x, &y, CONTAINED_TOO))
					return NULL;
				in_container = TRUE;
				break;
			    default:
			    	return NULL;
			}
		} else {
			/* only for invent, minvent, or floor */
			if (!get_obj_location(obj, &x, &y, 0))
			    return NULL;
		}
		if (in_container) {
			/* Rules for revival from containers:
			   - the container cannot be locked
			   - the container cannot be heavily nested (>2 is arbitrary)
			   - the container cannot be a statue or bag of holding
			     (except in very rare cases for the latter)
			 */
			if (!x || !y || container->olocked || container_nesting > 2 ||
			    container->otyp == STATUE ||
			    (container->otyp == BAG_OF_HOLDING && rn2(40)))
				return NULL;
		}

		if (MON_AT(level, x,y)) {
		    coord new_xy;

		    if (enexto(&new_xy, level, x, y, &mons[montype]))
			x = new_xy.x,  y = new_xy.y;
		}

		if (cant_create(&montype, TRUE)) {
			/* make a zombie or worm instead */
			mtmp = makemon(&mons[montype], level, x, y,
				       NO_MINVENT|MM_NOWAIT);
			if (mtmp) {
				mtmp->mhp = mtmp->mhpmax = 100;
				mon_adjust_speed(mtmp, 2, NULL); /* MFAST */
			}
		} else {
		    if (obj->oxlth && (obj->oattached == OATTACHED_MONST)) {
			    coord xy;
			    xy.x = x; xy.y = y;
			    mtmp = montraits(obj, &xy);
			    if (mtmp && mtmp->mtame && !mtmp->isminion)
				wary_dog(mtmp, TRUE);
		    } else
			    mtmp = makemon(&mons[montype], level, x, y,
				    NO_MINVENT|MM_NOWAIT|MM_NOCOUNTBIRTH);
		    if (mtmp) {
			if (obj->oxlth && (obj->oattached == OATTACHED_M_ID)) {
			    unsigned m_id;
			    struct monst *ghost;
			    memcpy(&m_id, obj->oextra, sizeof(m_id));
			    ghost = find_mid(level, m_id, FM_FMON);
			    if (ghost && ghost->data == &mons[PM_GHOST]) {
				    int x2, y2;
				    x2 = ghost->mx; y2 = ghost->my;
				    if (ghost->mtame)
					savetame = ghost->mtame;
				    if (canseemon(level, ghost))
					pline("%s is suddenly drawn into its former body!",
						Monnam(ghost));
				    mondead(ghost);
				    recorporealization = TRUE;
				    newsym(x2, y2);
			    }
			    /* don't mess with obj->oxlth here */
			    obj->oattached = OATTACHED_NOTHING;
			}
			/* Monster retains its name */
			if (obj->onamelth)
			    mtmp = christen_monst(mtmp, ONAME(obj));
			/* flag the quest leader as alive. */
			if (mtmp->data->msound == MS_LEADER || mtmp->m_id ==
				quest_status.leader_m_id)
			    quest_status.leader_is_dead = FALSE;
		    }
		}
		if (mtmp) {
			if (obj->oeaten)
				mtmp->mhp = eaten_stat(mtmp->mhp, obj);
			/* track that this monster was revived at least once */
			mtmp->mrevived = 1;

			if (recorporealization) {
				/* If mtmp is revivification of former tame ghost*/
				if (savetame) {
				    struct monst *mtmp2 = tamedog(mtmp, NULL);
				    if (mtmp2) {
					mtmp2->mtame = savetame;
					mtmp = mtmp2;
				    }
				}
				/* was ghost, now alive, it's all very confusing */
				mtmp->mconf = 1;
			}

			switch (obj->where) {
			    case OBJ_INVENT:
				useup(obj);
				break;
			    case OBJ_FLOOR:
				/* in case MON_AT+enexto for invisible mon */
				x = obj->ox,  y = obj->oy;
				/* not useupf(), which charges */
				if (obj->quan > 1L)
				    obj = splitobj(obj, 1L);
				delobj(obj);
				newsym(x, y);
				break;
			    case OBJ_MINVENT:
				m_useup(obj->ocarry, obj);
				break;
			    case OBJ_CONTAINED:
				obj_extract_self(obj);
				obfree(obj, NULL);
				break;
			    default:
				panic("revive");
			}
		}
	}
	return mtmp;
}